

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O2

void __thiscall gmath::SMatrix<long,_2,_3>::SMatrix(SMatrix<long,_2,_3> *this)

{
  int k;
  long lVar1;
  long (*palVar2) [3];
  int i;
  long lVar3;
  
  palVar2 = (long (*) [3])this;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      (*(long (*) [3])*palVar2)[lVar3] = 0;
    }
    palVar2 = palVar2 + 1;
  }
  this->v[0][0] = 1;
  this->v[1][1] = 1;
  return;
}

Assistant:

SMatrix()
    {
      for (int k=0; k<nrows; k++)
        for (int i=0; i<ncols; i++)
        {
          v[k][i]=0;
        }

      int n=nrows;

      if (ncols < nrows)
      {
        n=ncols;
      }

      for (int i=0; i<n; i++)
      {
        v[i][i]=1;
      }
    }